

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_pre_shared_key_parse_clienthello
               (SSL_HANDSHAKE *hs,CBS *out_ticket,CBS *out_binders,
               uint32_t *out_obfuscated_ticket_age,uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello
               ,CBS *contents)

{
  int iVar1;
  uint8_t *puVar2;
  size_t sVar3;
  undefined1 local_98 [8];
  CBS binder;
  size_t num_binders;
  undefined1 local_78 [4];
  uint32_t unused_obfuscated_ticket_age;
  CBS unused_ticket;
  size_t num_identities;
  CBS binders;
  CBS identities;
  SSL_CLIENT_HELLO *client_hello_local;
  uint8_t *out_alert_local;
  uint32_t *out_obfuscated_ticket_age_local;
  CBS *out_binders_local;
  CBS *out_ticket_local;
  SSL_HANDSHAKE *hs_local;
  
  puVar2 = CBS_data(contents);
  sVar3 = CBS_len(contents);
  if (puVar2 + sVar3 == client_hello->extensions + client_hello->extensions_len) {
    iVar1 = CBS_get_u16_length_prefixed(contents,(CBS *)&binders.len);
    if (((((iVar1 != 0) &&
          (iVar1 = CBS_get_u16_length_prefixed((CBS *)&binders.len,out_ticket), iVar1 != 0)) &&
         (iVar1 = CBS_get_u32((CBS *)&binders.len,out_obfuscated_ticket_age), iVar1 != 0)) &&
        ((iVar1 = CBS_get_u16_length_prefixed(contents,(CBS *)&num_identities), iVar1 != 0 &&
         (sVar3 = CBS_len((CBS *)&num_identities), sVar3 != 0)))) &&
       (sVar3 = CBS_len(contents), sVar3 == 0)) {
      out_binders->data = (uint8_t *)num_identities;
      out_binders->len = (size_t)binders.data;
      unused_ticket.len = 1;
      while( true ) {
        sVar3 = CBS_len((CBS *)&binders.len);
        if (sVar3 == 0) {
          binder.len = 0;
          while( true ) {
            sVar3 = CBS_len((CBS *)&num_identities);
            if (sVar3 == 0) {
              if (unused_ticket.len != binder.len) {
                ERR_put_error(0x10,0,0x10f,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                              ,0x7e1);
                *out_alert = '/';
                return false;
              }
              return true;
            }
            iVar1 = CBS_get_u8_length_prefixed((CBS *)&num_identities,(CBS *)local_98);
            if (iVar1 == 0) break;
            binder.len = binder.len + 1;
          }
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x7d8);
          *out_alert = '2';
          return false;
        }
        iVar1 = CBS_get_u16_length_prefixed((CBS *)&binders.len,(CBS *)local_78);
        if ((iVar1 == 0) ||
           (iVar1 = CBS_get_u32((CBS *)&binders.len,(uint32_t *)((long)&num_binders + 4)),
           iVar1 == 0)) break;
        unused_ticket.len = unused_ticket.len + 1;
      }
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x7ca);
      *out_alert = '2';
      return false;
    }
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x7bc);
    *out_alert = '2';
  }
  else {
    ERR_put_error(0x10,0,0x10b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x7af);
    *out_alert = '/';
  }
  return false;
}

Assistant:

bool ssl_ext_pre_shared_key_parse_clienthello(
    SSL_HANDSHAKE *hs, CBS *out_ticket, CBS *out_binders,
    uint32_t *out_obfuscated_ticket_age, uint8_t *out_alert,
    const SSL_CLIENT_HELLO *client_hello, CBS *contents) {
  // Verify that the pre_shared_key extension is the last extension in
  // ClientHello.
  if (CBS_data(contents) + CBS_len(contents) !=
      client_hello->extensions + client_hello->extensions_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PRE_SHARED_KEY_MUST_BE_LAST);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // We only process the first PSK identity since we don't support pure PSK.
  CBS identities, binders;
  if (!CBS_get_u16_length_prefixed(contents, &identities) ||    //
      !CBS_get_u16_length_prefixed(&identities, out_ticket) ||  //
      !CBS_get_u32(&identities, out_obfuscated_ticket_age) ||   //
      !CBS_get_u16_length_prefixed(contents, &binders) ||       //
      CBS_len(&binders) == 0 ||                                 //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  *out_binders = binders;

  // Check the syntax of the remaining identities, but do not process them.
  size_t num_identities = 1;
  while (CBS_len(&identities) != 0) {
    CBS unused_ticket;
    uint32_t unused_obfuscated_ticket_age;
    if (!CBS_get_u16_length_prefixed(&identities, &unused_ticket) ||
        !CBS_get_u32(&identities, &unused_obfuscated_ticket_age)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    num_identities++;
  }

  // Check the syntax of the binders. The value will be checked later if
  // resuming.
  size_t num_binders = 0;
  while (CBS_len(&binders) != 0) {
    CBS binder;
    if (!CBS_get_u8_length_prefixed(&binders, &binder)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    num_binders++;
  }

  if (num_identities != num_binders) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PSK_IDENTITY_BINDER_COUNT_MISMATCH);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}